

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::FindInitializationErrors
               (Message *message,string *prefix,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors)

{
  FieldDescriptor *this;
  char cVar1;
  int iVar2;
  CppType CVar3;
  undefined4 extraout_var;
  long *plVar5;
  Message *pMVar6;
  ulong uVar7;
  long lVar8;
  int index;
  long lVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar4;
  undefined4 extraout_var_00;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
  lVar8 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(lVar4 + 0x2c); lVar9 = lVar9 + 1) {
    if (*(int *)(*(long *)(lVar4 + 0x30) + 0x4c + lVar8) == 2) {
      cVar1 = (**(code **)(*plVar5 + 0x28))(plVar5,message,*(long *)(lVar4 + 0x30) + lVar8);
      if (cVar1 == '\0') {
        std::operator+(&local_50,prefix,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(lVar4 + 0x30) + lVar8));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   &local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    lVar8 = lVar8 + 0xa8;
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar5 + 0x80))(plVar5,message);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    this = fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7];
    CVar3 = FieldDescriptor::cpp_type(this);
    if (CVar3 == CPPTYPE_MESSAGE) {
      if (*(int *)(this + 0x4c) == 3) {
        iVar2 = (**(code **)(*plVar5 + 0x30))(plVar5,message,this);
        index = 0;
        if (iVar2 < 1) {
          iVar2 = index;
        }
        for (; iVar2 != index; index = index + 1) {
          pMVar6 = (Message *)(**(code **)(*plVar5 + 0x1a0))(plVar5,message,this,index);
          SubMessagePrefix(&local_50,prefix,this,index);
          FindInitializationErrors(pMVar6,&local_50,errors);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else {
        pMVar6 = (Message *)(**(code **)(*plVar5 + 0xd8))(plVar5,message,this,0);
        SubMessagePrefix(&local_50,prefix,this,-1);
        FindInitializationErrors(pMVar6,&local_50,errors);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void ReflectionOps::FindInitializationErrors(
    const Message& message,
    const string& prefix,
    std::vector<string>* errors) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        errors->push_back(prefix + descriptor->field(i)->name());
      }
    }
  }

  // Check sub-messages.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, field, j);
          FindInitializationErrors(sub_message,
                                   SubMessagePrefix(prefix, field, j),
                                   errors);
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, field);
        FindInitializationErrors(sub_message,
                                 SubMessagePrefix(prefix, field, -1),
                                 errors);
      }
    }
  }
}